

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

void __thiscall
mp::BasicConstraintKeeper::DoAddAcceptanceOptions
          (BasicConstraintKeeper *this,BasicFlatConverter *param_1,BasicFlatModelAPI *ma,Env *env)

{
  int *value;
  int *args;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  SolverOptionManager *this_00;
  int *in_R8;
  ValueArrayRef values;
  ValueArrayRef values_00;
  ValueArrayRef values_01;
  char *local_58;
  string local_50;
  char *name;
  
  iVar1 = (*this->_vptr_BasicConstraintKeeper[0x10])(this,ma);
  iVar2 = (*this->_vptr_BasicConstraintKeeper[0x11])(this,ma);
  iVar3 = (*this->_vptr_BasicConstraintKeeper[0x12])(this,ma);
  value = &this->acc_level_item_;
  this->acc_level_item_ = -1;
  args = &this->acc_level_default_;
  iVar4 = iVar2 + 2;
  if (iVar3 == 0) {
    iVar4 = iVar1;
  }
  if (iVar2 == 0) {
    iVar4 = iVar1;
  }
  this->acc_level_default_ = iVar4;
  this_00 = &env->super_SolverOptionManager;
  iVar4 = (*this->_vptr_BasicConstraintKeeper[0x1b])(this);
  name = (char *)CONCAT44(extraout_var,iVar4);
  if (iVar2 != 0 && iVar1 != 0) {
    local_58 = this->constr_name_;
    fmt::format<char_const*,int>
              (&local_50,
               (fmt *)
               "Solver acceptance level for \'{}\' as either constraint or expression, default {}:\n\n.. value-table::"
               ,(CStringRef)&local_58,(char **)args,in_R8);
    values_00._8_8_ = 5;
    values_00.values_ = (OptionValueInfo *)values_universal_acceptance;
    SolverOptionManager::AddStoredOption<int>
              (this_00,name,local_50._M_dataplus._M_p,value,values_00);
  }
  else if (iVar1 == 0) {
    if (iVar2 == 0) {
      SolverOptionManager::AddStoredOption<int>(this_00,name,"HIDDEN",value,0,4);
      return;
    }
    local_58 = this->constr_name_;
    fmt::format<char_const*,int>
              (&local_50,
               (fmt *)
               "Solver acceptance level for \'{}\' as expression, default {}:\n\n.. value-table::",
               (CStringRef)&local_58,(char **)args,in_R8);
    values_01._8_8_ = 3;
    values_01.values_ = (OptionValueInfo *)values_expr_acceptance;
    SolverOptionManager::AddStoredOption<int>
              (this_00,name,local_50._M_dataplus._M_p,value,values_01);
  }
  else {
    local_58 = this->constr_name_;
    fmt::format<char_const*,int>
              (&local_50,
               (fmt *)
               "Solver acceptance level for \'{}\' as flat constraint, default {}:\n\n.. value-table::"
               ,(CStringRef)&local_58,(char **)args,in_R8);
    values._8_8_ = 3;
    values.values_ = (OptionValueInfo *)values_con_acceptance;
    SolverOptionManager::AddStoredOption<int>(this_00,name,local_50._M_dataplus._M_p,value,values);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void BasicConstraintKeeper::DoAddAcceptanceOptions(
    BasicFlatConverter& ,
    const BasicFlatModelAPI& ma,
    Env& env) {
  auto cal = GetModelAPIAcceptance(ma);
  auto eal = GetModelAPIAcceptanceEXPR(ma);
  auto eial = GetModelAPIAcceptance_EXPR_INTF(ma);
  const bool conacc = (ConstraintAcceptanceLevel::NotAccepted != cal);
  const bool expracc = (ExpressionAcceptanceLevel::NotAccepted != eal);
  const bool expr_intf_acc = (ExpressionAcceptanceLevel::NotAccepted != eial);
  acc_level_item_ = -1;           // user: unset
  acc_level_default_ = 0;         // default: not accepted
  if (conacc)
    acc_level_default_
        = std::underlying_type_t<ConstraintAcceptanceLevel>(cal);
  // we prefer expressions, if ModelAPI accepts expression interface
  if (expracc && expr_intf_acc)
    acc_level_default_      // Won't be taken however, if acc:_expr==0
        = std::underlying_type_t<ExpressionAcceptanceLevel>(eal) + 2;
  if (conacc && expracc) {
    env.AddStoredOption(GetAcceptanceOptionNames(),
                        fmt::format(
                            "Solver acceptance level for '{}' as either constraint or expression, "
                            "default {}:\n\n.. value-table::",
                            GetConstraintName(), acc_level_default_).c_str(),
                        acc_level_item_, values_universal_acceptance);
  } else
    if (conacc) {
      env.AddStoredOption(GetAcceptanceOptionNames(),
                          fmt::format(
                              "Solver acceptance level for '{}' as flat constraint, "
                              "default {}:\n\n.. value-table::",
                              GetConstraintName(), acc_level_default_).c_str(),
                          acc_level_item_, values_con_acceptance);
    } else
      if (expracc) {
        env.AddStoredOption(GetAcceptanceOptionNames(),
                            fmt::format(
                                "Solver acceptance level for '{}' as expression, "
                                "default {}:\n\n.. value-table::",
                                GetConstraintName(), acc_level_default_).c_str(),
                            acc_level_item_, values_expr_acceptance);
      } else {
        env.AddStoredOption(GetAcceptanceOptionNames(),
                            "HIDDEN",
                            acc_level_item_, 0, 4);
      }
}